

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

bool __thiscall
Inline::TryGetCallApplyInlineeData
          (Inline *this,FunctionJITTimeInfo *inlinerData,Instr *callInstr,Instr *callApplyLdInstr,
          Instr *callApplyTargetLdInstr,FunctionJITTimeInfo **inlineeData,
          InlineCacheIndex *inlineCacheIndex,Instr **callbackDefInstr,bool isCallInstanceFunction,
          CallApplyTargetSourceType *targetType)

{
  TSize TVar1;
  bool bVar2;
  ProfileId callApplyCallSiteId_00;
  uint sourceContextId;
  uint functionId;
  ProfiledInstr *pPVar3;
  FldInfo *pFVar4;
  Opnd *this_00;
  SymOpnd *this_01;
  PropertySymOpnd *pPVar5;
  FunctionJITTimeInfo *pFVar6;
  JITTimeFunctionBody *this_02;
  JITTimeWorkItem *this_03;
  ProfileId callApplyCallSiteId;
  ProfileId callSiteId;
  Opnd *callTargetLdOpnd;
  bool isCallInstanceFunction_local;
  FunctionJITTimeInfo **inlineeData_local;
  Instr *callApplyTargetLdInstr_local;
  Instr *callApplyLdInstr_local;
  Instr *callInstr_local;
  FunctionJITTimeInfo *inlinerData_local;
  Inline *this_local;
  
  *callbackDefInstr = (Instr *)0x0;
  if (callApplyTargetLdInstr->m_opcode == LdFldForCallApplyTarget) {
    pPVar3 = IR::Instr::AsProfiledInstr(callApplyTargetLdInstr);
    pFVar4 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                       ((anon_union_8_4_88fdcd80 *)&(pPVar3->u).field_3);
    if ((pFVar4->flags & FldInfo_FromAccessor) == FldInfo_NoInfo) {
      this_00 = IR::Instr::GetSrc1(callApplyTargetLdInstr);
      bVar2 = IR::Opnd::IsSymOpnd(this_00);
      if (bVar2) {
        this_01 = IR::Opnd::AsSymOpnd(this_00);
        bVar2 = IR::SymOpnd::IsPropertySymOpnd(this_01);
        if (bVar2) {
          pPVar5 = IR::Opnd::AsPropertySymOpnd(this_00);
          *inlineCacheIndex = pPVar5->m_inlineCacheIndex;
          pFVar6 = FunctionJITTimeInfo::GetLdFldInlinee(inlinerData,*inlineCacheIndex);
          *inlineeData = pFVar6;
          goto LAB_0071f6ac;
        }
      }
      return false;
    }
  }
LAB_0071f6ac:
  if (*inlineeData == (FunctionJITTimeInfo *)0x0) {
    bVar2 = TryGetCallApplyCallbackTargetInlineeData
                      (this,inlinerData,callInstr,callApplyLdInstr,inlineeData,callbackDefInstr,
                       isCallInstanceFunction);
    if (bVar2) {
      *targetType = Callback;
      this_local._7_1_ = true;
    }
    else {
      if (!isCallInstanceFunction) {
        sourceContextId = Func::GetSourceContextId(callInstr->m_func);
        functionId = Func::GetLocalFunctionId(callInstr->m_func);
        bVar2 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_01eafdf0,InlineAnyCallApplyTargetPhase,sourceContextId,
                           functionId);
        if (!bVar2) {
          pPVar3 = IR::Instr::AsProfiledInstr(callInstr);
          TVar1 = (pPVar3->u).field_3.fldInfoData;
          this_02 = Func::GetJITFunctionBody(callInstr->m_func);
          callApplyCallSiteId_00 =
               JITTimeFunctionBody::GetCallApplyCallSiteIdForCallSiteId(this_02,TVar1.f1);
          if (callApplyCallSiteId_00 != 0xffff) {
            this_03 = Func::GetWorkItem(callInstr->m_func);
            pFVar6 = JITTimeWorkItem::GetJITTimeInfo(this_03);
            pFVar6 = FunctionJITTimeInfo::GetCallApplyTargetInlinee(pFVar6,callApplyCallSiteId_00);
            *inlineeData = pFVar6;
          }
        }
      }
      if (*inlineeData != (FunctionJITTimeInfo *)0x0) {
        *targetType = Other;
      }
      this_local._7_1_ = *inlineeData != (FunctionJITTimeInfo *)0x0;
    }
  }
  else {
    *targetType = LdFld;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
Inline::TryGetCallApplyInlineeData(
    const FunctionJITTimeInfo* inlinerData,
    IR::Instr * callInstr,
    IR::Instr * callApplyLdInstr,
    IR::Instr * callApplyTargetLdInstr,
    const FunctionJITTimeInfo ** inlineeData,
    Js::InlineCacheIndex * inlineCacheIndex,
    IR::Instr ** callbackDefInstr,
    bool isCallInstanceFunction,
    CallApplyTargetSourceType* targetType
    )
{
    *callbackDefInstr = nullptr;

    if (callApplyTargetLdInstr->m_opcode == Js::OpCode::LdFldForCallApplyTarget &&
        ((callApplyTargetLdInstr->AsProfiledInstr()->u.FldInfo().flags & Js::FldInfo_FromAccessor) == 0))
    {
        IR::Opnd *callTargetLdOpnd = callApplyTargetLdInstr->GetSrc1();
        if (!callTargetLdOpnd->IsSymOpnd() || !callTargetLdOpnd->AsSymOpnd()->IsPropertySymOpnd())
        {
            return false;
        }

        *inlineCacheIndex = callTargetLdOpnd->AsPropertySymOpnd()->m_inlineCacheIndex;
        *inlineeData = inlinerData->GetLdFldInlinee(*inlineCacheIndex);
    }

    if (*inlineeData)
    {
        *targetType = CallApplyTargetSourceType::LdFld;
        return true;
    }

    if (TryGetCallApplyCallbackTargetInlineeData(inlinerData, callInstr, callApplyLdInstr, inlineeData, callbackDefInstr, isCallInstanceFunction))
    {
        *targetType = CallApplyTargetSourceType::Callback;
        return true;
    }

    if (!isCallInstanceFunction && !PHASE_OFF(Js::InlineAnyCallApplyTargetPhase, callInstr->m_func))
    {
        Js::ProfileId callSiteId = static_cast<Js::ProfileId>(callInstr->AsProfiledInstr()->u.profileId);
        Js::ProfileId callApplyCallSiteId = callInstr->m_func->GetJITFunctionBody()->GetCallApplyCallSiteIdForCallSiteId(callSiteId);

        if (callApplyCallSiteId != Js::Constants::NoProfileId)
        {
            *inlineeData = callInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetCallApplyTargetInlinee(callApplyCallSiteId);
        }
    }
    if (*inlineeData)
    {
        *targetType = CallApplyTargetSourceType::Other;
    }
    return *inlineeData != nullptr;
}